

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::EventImport,_std::default_delete<wabt::EventImport>_>
wabt::MakeUnique<wabt::EventImport>(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<wabt::EventImport,_std::default_delete<wabt::EventImport>,_true,_true> in_RDI;
  
  puVar1 = (undefined8 *)operator_new(0xf0);
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  puVar1[5] = puVar1 + 7;
  puVar1[6] = 0;
  *(undefined1 *)(puVar1 + 7) = 0;
  *(undefined4 *)(puVar1 + 9) = 4;
  *puVar1 = &PTR__EventImport_001e0bb0;
  Event::Event((Event *)(puVar1 + 10),(string_view)ZEXT816(0));
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<wabt::EventImport,_std::default_delete<wabt::EventImport>_>._M_t.
   super__Tuple_impl<0UL,_wabt::EventImport_*,_std::default_delete<wabt::EventImport>_>.
   super__Head_base<0UL,_wabt::EventImport_*,_false>._M_head_impl = puVar1;
  return (__uniq_ptr_data<wabt::EventImport,_std::default_delete<wabt::EventImport>,_true,_true>)
         (tuple<wabt::EventImport_*,_std::default_delete<wabt::EventImport>_>)
         in_RDI.super___uniq_ptr_impl<wabt::EventImport,_std::default_delete<wabt::EventImport>_>.
         _M_t.super__Tuple_impl<0UL,_wabt::EventImport_*,_std::default_delete<wabt::EventImport>_>.
         super__Head_base<0UL,_wabt::EventImport_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}